

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  int iVar1;
  void *in_RCX;
  long in_RDX;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  secp256k1_gej *in_stack_fffffffffffffe00;
  undefined1 local_140 [96];
  undefined1 local_e0 [96];
  undefined1 local_80 [96];
  void *local_20;
  long local_18;
  void *local_10;
  void *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_gej_verify(in_stack_fffffffffffffe00);
  secp256k1_ge_verify((secp256k1_ge *)in_stack_fffffffffffffe00);
  if (*(int *)((long)local_10 + 0x90) == 0) {
    if (*(int *)(local_18 + 0x60) == 0) {
      secp256k1_fe_sqr(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                      );
      memcpy(local_80,local_10,0x30);
      secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                       ,(secp256k1_fe *)0x133bb7);
      memcpy(local_e0,(void *)((long)local_10 + 0x30),0x30);
      secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                       ,(secp256k1_fe *)0x133bf6);
      secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                       ,(secp256k1_fe *)0x133c12);
      secp256k1_fe_negate_unchecked
                (&in_stack_fffffffffffffe00->x,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
      secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                      );
      secp256k1_fe_negate_unchecked
                (&in_stack_fffffffffffffe00->x,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
      secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                      );
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x133c7d);
      if (iVar1 == 0) {
        *(undefined4 *)((long)local_8 + 0x90) = 0;
        if (local_20 != (void *)0x0) {
          memcpy(local_20,local_140,0x30);
        }
        secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (secp256k1_fe *)0x133d3b);
        secp256k1_fe_sqr(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_negate_unchecked
                  (&in_stack_fffffffffffffe00->x,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
        secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (secp256k1_fe *)0x133d76);
        secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (secp256k1_fe *)0x133d8d);
        secp256k1_fe_sqr(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (secp256k1_fe *)0x133e08);
        secp256k1_fe_mul(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (secp256k1_fe *)0x133e1d);
        secp256k1_fe_add(&in_stack_fffffffffffffe00->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        secp256k1_gej_verify(in_stack_fffffffffffffe00);
        if (local_20 != (void *)0x0) {
          secp256k1_fe_verify(&in_stack_fffffffffffffe00->x);
        }
      }
      else {
        iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x133c8f);
        if (iVar1 == 0) {
          if (local_20 != (void *)0x0) {
            secp256k1_fe_set_int(&in_stack_fffffffffffffe00->x,in_stack_fffffffffffffdfc);
          }
          secp256k1_gej_set_infinity((secp256k1_gej *)0x133cda);
        }
        else {
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffe00,
                     (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (secp256k1_fe *)0x133cb1);
        }
      }
    }
    else {
      if (local_20 != (void *)0x0) {
        secp256k1_fe_set_int(&in_stack_fffffffffffffe00->x,in_stack_fffffffffffffdfc);
      }
      memcpy(local_8,local_10,0x98);
    }
  }
  else {
    if (local_20 != (void *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/group_impl.h"
              ,0x22f,"test condition failed: rzr == NULL");
      abort();
    }
    secp256k1_gej_set_ge
              (in_stack_fffffffffffffe00,
               (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* Operations: 8 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
    if (rzr != NULL) SECP256K1_FE_VERIFY(rzr);
}